

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *p,Ivy_Obj_t *pOld,Ivy_Obj_t *pNew)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  Ivy_Obj_t *pIVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  timespec ts;
  timespec local_40;
  
  if (pOld == (Ivy_Obj_t *)0x0 && pNew == (Ivy_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0xa50,
                  "int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if ((p->pSat->act_vars).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (p->pSat->act_vars).size = 0;
  Ivy_ManIncrementTravId(p->pManFraig);
  dVar1 = p->pParams->dActConeRatio;
  if ((dVar1 <= 0.0) || (1.0 <= dVar1)) {
    __assert_fail("p->pParams->dActConeRatio > 0 && p->pParams->dActConeRatio < 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0xa57,
                  "int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  uVar3 = 0;
  uVar6 = 0;
  if (pNew != (Ivy_Obj_t *)0x0) {
    uVar6 = *(uint *)&pNew->field_0x8 >> 0xb;
  }
  if (pOld != (Ivy_Obj_t *)0x0) {
    uVar3 = *(uint *)&pOld->field_0x8 >> 0xb;
  }
  if (uVar3 < uVar6) {
    pIVar4 = pNew;
    if (pNew != (Ivy_Obj_t *)0x0) {
LAB_007e91b9:
      uVar3 = *(uint *)&pIVar4->field_0x8 >> 0xb;
      goto LAB_007e91bf;
    }
  }
  else {
    pIVar4 = pOld;
    if (pOld != (Ivy_Obj_t *)0x0) goto LAB_007e91b9;
  }
  uVar3 = 0;
LAB_007e91bf:
  iVar2 = (int)((1.0 - dVar1) * (double)uVar3);
  if ((pOld != (Ivy_Obj_t *)0x0) && (pOld->Id != 0)) {
    Ivy_FraigSetActivityFactors_rec(p,pOld,iVar2,uVar3);
  }
  if ((pNew != (Ivy_Obj_t *)0x0) && (pNew->Id != 0)) {
    Ivy_FraigSetActivityFactors_rec(p,pNew,iVar2,uVar3);
  }
  uVar3 = clock_gettime(3,&local_40);
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 0) {
    lVar8 = -1;
  }
  else {
    uVar5 = local_40.tv_sec * 1000000;
    lVar8 = local_40.tv_nsec / 1000 + uVar5;
  }
  p->timeTrav = p->timeTrav + lVar8 + lVar7;
  return (int)uVar5;
}

Assistant:

int Ivy_FraigSetActivityFactors( Ivy_FraigMan_t * p, Ivy_Obj_t * pOld, Ivy_Obj_t * pNew )
{
    int LevelMin, LevelMax;
    abctime clk;
    assert( pOld || pNew );
clk = Abc_Clock(); 
    // reset the active variables
    veci_resize(&p->pSat->act_vars, 0);
    // prepare for traversal
    Ivy_ManIncrementTravId( p->pManFraig );
    // determine the min and max level to visit
    assert( p->pParams->dActConeRatio > 0 && p->pParams->dActConeRatio < 1 );
    LevelMax = IVY_MAX( (pNew ? pNew->Level : 0), (pOld ? pOld->Level : 0) );
    LevelMin = (int)(LevelMax * (1.0 - p->pParams->dActConeRatio));
    // traverse
    if ( pOld && !Ivy_ObjIsConst1(pOld) )
        Ivy_FraigSetActivityFactors_rec( p, pOld, LevelMin, LevelMax );
    if ( pNew && !Ivy_ObjIsConst1(pNew) )
        Ivy_FraigSetActivityFactors_rec( p, pNew, LevelMin, LevelMax );
//Ivy_FraigPrintActivity( p );
p->timeTrav += Abc_Clock() - clk;
    return 1;
}